

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XMLReader.cpp
# Opt level: O1

bool __thiscall xercesc_4_0::XMLReader::skippedStringLong(XMLReader *this,XMLCh *toSkip)

{
  short *psVar1;
  XMLSize_t XVar2;
  bool bVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  
  uVar6 = 0;
  if (toSkip != (XMLCh *)0x0) {
    do {
      psVar1 = (short *)((long)toSkip + uVar6);
      uVar6 = uVar6 + 2;
    } while (*psVar1 != 0);
    uVar6 = ((long)uVar6 >> 1) - 1;
  }
  uVar7 = this->fCharsAvail - this->fCharIndex;
  for (; uVar6 != 0; uVar6 = uVar6 - uVar5) {
    while ((uVar7 < uVar6 && (uVar7 != 0x4000))) {
      bVar3 = refreshCharBuffer(this);
      if ((!bVar3) ||
         (uVar5 = this->fCharsAvail - this->fCharIndex, bVar3 = uVar5 == uVar7, uVar7 = uVar5, bVar3
         )) goto LAB_002c5a87;
    }
    uVar5 = uVar6;
    if (uVar7 < uVar6) {
      uVar5 = uVar7;
    }
    XVar2 = this->fCharIndex;
    iVar4 = bcmp(this->fCharBuf + XVar2,toSkip,uVar5 * 2);
    if (iVar4 != 0) break;
    toSkip = toSkip + uVar5;
    this->fCharIndex = XVar2 + uVar5;
    this->fCurCol = this->fCurCol + uVar5;
    uVar7 = uVar7 - uVar5;
  }
LAB_002c5a87:
  return uVar6 == 0;
}

Assistant:

bool XMLReader::skippedStringLong(const XMLCh* toSkip)
{
    // This function works on strings that are potentially longer than
    // kCharBufSize (e.g., end tag). This function does not guarantee
    // that in case the comparison is unsuccessful the fCharIndex will
    // point to the original data.
    //

    XMLSize_t srcLen = XMLString::stringLen(toSkip);
    XMLSize_t charsLeft = charsLeftInBuffer();

    while (srcLen != 0)
    {
      // Fill up the buffer with as much data as possible.
      //
      while (charsLeft < srcLen && charsLeft != kCharBufSize)
      {
        if (!refreshCharBuffer())
          return false;

        XMLSize_t tmp = charsLeftInBuffer();
        if (tmp == charsLeft) // if the refreshCharBuf() did not add anything
          return false;       // new give up and return.

        charsLeft = tmp;
      }

      XMLSize_t n = charsLeft < srcLen ? charsLeft : srcLen;

      if (memcmp(&fCharBuf[fCharIndex], toSkip, n * sizeof(XMLCh)))
        return false;

      toSkip += n;
      srcLen -= n;

      fCharIndex += n;
      fCurCol += (XMLFileLoc)n;
      charsLeft -= n;
    }

    return true;
}